

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

void Diligent::PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount
               (PRIMITIVE_TOPOLOGY PrimTopology,VkPrimitiveTopology *VkPrimTopology,
               uint32_t *PatchControlPoints)

{
  char (*in_RCX) [113];
  undefined7 in_register_00000039;
  string msg;
  string local_40;
  
  *PatchControlPoints = 0;
  switch(CONCAT71(in_register_00000039,PrimTopology) & 0xffffffff) {
  case 0:
    FormatString<char[29]>(&local_40,(char (*) [29])"Undefined primitive topology");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x429);
    std::__cxx11::string::~string((string *)&local_40);
  case 1:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    break;
  case 2:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    break;
  case 3:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    break;
  case 4:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    break;
  case 5:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
    break;
  case 6:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY;
    break;
  case 7:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
    break;
  case 8:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
    break;
  case 9:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY;
    break;
  default:
    if (0x1f < (byte)(PrimTopology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST)) {
      FormatString<char[26],char[113]>
                (&local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "PrimTopology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && PrimTopology < PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES"
                 ,in_RCX);
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x452);
      std::__cxx11::string::~string((string *)&local_40);
    }
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
    *PatchControlPoints = (int)CONCAT71(in_register_00000039,PrimTopology) - 9;
  }
  return;
}

Assistant:

void PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount(PRIMITIVE_TOPOLOGY   PrimTopology,
                                                             VkPrimitiveTopology& VkPrimTopology,
                                                             uint32_t&            PatchControlPoints)
{
    PatchControlPoints = 0;
    static_assert(PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES == 42, "Did you add a new primitive topology? Please handle it here.");
    switch (PrimTopology)
    {
        case PRIMITIVE_TOPOLOGY_UNDEFINED:
            UNEXPECTED("Undefined primitive topology");
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
            return;

        case PRIMITIVE_TOPOLOGY_POINT_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_STRIP:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY;
            return;

        default:
            VERIFY_EXPR(PrimTopology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && PrimTopology < PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES);
            VkPrimTopology     = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
            PatchControlPoints = static_cast<uint32_t>(PrimTopology) - static_cast<uint32_t>(PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) + 1;
            return;
    }
}